

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall PSVIWriterHandlers::processFields(PSVIWriterHandlers *this,StringList *fields)

{
  uint uVar1;
  char16_t *xpath;
  
  sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  for (uVar1 = 0; (ulong)uVar1 < (fields->super_BaseRefVectorOf<char16_t>).fCurCount;
      uVar1 = uVar1 + 1) {
    xpath = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                      (&fields->super_BaseRefVectorOf<char16_t>,(ulong)uVar1);
    processXPath(this,xpath);
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  return;
}

Assistant:

void PSVIWriterHandlers::processFields(StringList* fields) {
	sendIndentedElement(PSVIUni::fgFields);
	for (unsigned int i=0; i < fields->size(); i++) {
		processXPath(fields->elementAt(i));
	}
	sendUnindentedElement(PSVIUni::fgFields);
}